

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall sqlite_orm::internal::connection_holder::retain(connection_holder *this)

{
  int __v;
  undefined8 uVar1;
  error_category *__cat;
  long in_RDI;
  char *in_stack_00000028;
  system_error *in_stack_00000030;
  error_code in_stack_00000038;
  int rc;
  error_code local_20;
  int local_c;
  
  *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + 1;
  if (*(int *)(in_RDI + 0x28) == 1) {
    uVar1 = std::__cxx11::string::c_str();
    local_c = sqlite3_open(uVar1,in_RDI + 0x20);
    if (local_c != 0) {
      uVar1 = __cxa_allocate_exception(0x20);
      __v = sqlite3_errcode(*(undefined8 *)(in_RDI + 0x20));
      __cat = &get_sqlite_error_category()->super_error_category;
      std::error_code::error_code(&local_20,__v,__cat);
      sqlite3_errmsg(*(undefined8 *)(in_RDI + 0x20));
      std::system_error::system_error(in_stack_00000030,in_stack_00000038,in_stack_00000028);
      __cxa_throw(uVar1,&std::system_error::typeinfo,std::system_error::~system_error);
    }
  }
  return;
}

Assistant:

void retain() {
        ++this->_retain_count;
        if(1 == this->_retain_count) {
            auto rc = sqlite3_open(this->filename.c_str(), &this->db);
            if(rc != SQLITE_OK) {
                throw std::system_error(std::error_code(sqlite3_errcode(this->db), get_sqlite_error_category()),
                                        sqlite3_errmsg(this->db));
            }
        }
    }